

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-create.cc
# Opt level: O0

void __thiscall ImageProvider::ImageProvider(ImageProvider *this,string *color_space,string *filter)

{
  bool bVar1;
  int local_74 [21];
  string *local_20;
  string *filter_local;
  string *color_space_local;
  ImageProvider *this_local;
  
  local_20 = filter;
  filter_local = color_space;
  color_space_local = (string *)this;
  QPDFObjectHandle::StreamDataProvider::StreamDataProvider(&this->super_StreamDataProvider,false);
  *(undefined ***)this = &PTR__ImageProvider_0011baf8;
  this->width = 400;
  this->stripe_height = 0x50;
  std::__cxx11::string::string((string *)&this->color_space,(string *)filter_local);
  std::__cxx11::string::string((string *)&this->filter,(string *)local_20);
  this->n_stripes = 6;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->stripes);
  this->j_color_space = JCS_UNKNOWN;
  bVar1 = std::operator==(filter_local,"/DeviceCMYK");
  if (bVar1) {
    this->j_color_space = JCS_CMYK;
    local_74[0x11] = 4;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[5],int>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->stripes,
               &anon_var_dwarf_8540,local_74 + 0x11);
    local_74[0x10] = 4;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[5],int>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->stripes,
               (char (*) [5])"",local_74 + 0x10);
    local_74[0xf] = 4;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[5],int>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->stripes,
               (char (*) [5])"",local_74 + 0xf);
    local_74[0xe] = 4;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[5],int>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->stripes,
               &anon_var_dwarf_856f,local_74 + 0xe);
    local_74[0xd] = 4;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[5],int>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->stripes,
               &anon_var_dwarf_857a,local_74 + 0xd);
    local_74[0xc] = 4;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[5],int>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->stripes,
               (char (*) [5])"",local_74 + 0xc);
  }
  else {
    bVar1 = std::operator==(filter_local,"/DeviceRGB");
    if (bVar1) {
      this->j_color_space = JCS_RGB;
      local_74[0xb] = 3;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[4],int>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->stripes
                 ,&anon_var_dwarf_85a9,local_74 + 0xb);
      local_74[10] = 3;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[4],int>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->stripes
                 ,(char (*) [4])"",local_74 + 10);
      local_74[9] = 3;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[4],int>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->stripes
                 ,(char (*) [4])"",local_74 + 9);
      local_74[8] = 3;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[4],int>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->stripes
                 ,&anon_var_dwarf_85d8,local_74 + 8);
      local_74[7] = 3;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[4],int>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->stripes
                 ,&anon_var_dwarf_85e3,local_74 + 7);
      local_74[6] = 3;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[4],int>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->stripes
                 ,(char (*) [4])"",local_74 + 6);
    }
    else {
      bVar1 = std::operator==(filter_local,"/DeviceGray");
      if (bVar1) {
        this->j_color_space = JCS_GRAYSCALE;
        local_74[5] = 1;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[2],int>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &this->stripes,&anon_var_dwarf_8604,local_74 + 5);
        local_74[4] = 1;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[2],int>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &this->stripes,&anon_var_dwarf_861d,local_74 + 4);
        local_74[3] = 1;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[2],int>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &this->stripes,&anon_var_dwarf_8628,local_74 + 3);
        local_74[2] = 1;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[2],int>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &this->stripes,(char (*) [2])"f",local_74 + 2);
        local_74[1] = 1;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[2],int>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &this->stripes,(char (*) [2])"3",local_74 + 1);
        local_74[0] = 1;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[2],int>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &this->stripes,(char (*) [2])"",local_74);
      }
    }
  }
  return;
}

Assistant:

ImageProvider::ImageProvider(std::string const& color_space, std::string const& filter) :
    color_space(color_space),
    filter(filter)
{
    if (color_space == "/DeviceCMYK") {
        j_color_space = JCS_CMYK;
        stripes.emplace_back("\xff\x00\x00\x00", 4);
        stripes.emplace_back("\x00\xff\x00\x00", 4);
        stripes.emplace_back("\x00\x00\xff\x00", 4);
        stripes.emplace_back("\xff\x00\xff\x00", 4);
        stripes.emplace_back("\xff\xff\x00\x00", 4);
        stripes.emplace_back("\x00\x00\x00\xff", 4);
    } else if (color_space == "/DeviceRGB") {
        j_color_space = JCS_RGB;
        stripes.emplace_back("\xff\x00\x00", 3);
        stripes.emplace_back("\x00\xff\x00", 3);
        stripes.emplace_back("\x00\x00\xff", 3);
        stripes.emplace_back("\xff\x00\xff", 3);
        stripes.emplace_back("\xff\xff\x00", 3);
        stripes.emplace_back("\x00\x00\x00", 3);
    } else if (color_space == "/DeviceGray") {
        j_color_space = JCS_GRAYSCALE;
        stripes.emplace_back("\xee", 1);
        stripes.emplace_back("\xcc", 1);
        stripes.emplace_back("\x99", 1);
        stripes.emplace_back("\x66", 1);
        stripes.emplace_back("\x33", 1);
        stripes.emplace_back("\x00", 1);
    }
}